

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_operator.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformAExprInternal(Transformer *this,PGAExpr *root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  undefined8 uVar5;
  char *pcVar6;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var7;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var8;
  size_type sVar9;
  ExpressionType EVar10;
  bool bVar11;
  PGValue *pPVar12;
  pointer pSVar13;
  pointer pSVar14;
  pointer pSVar15;
  type expr;
  PGList *pPVar16;
  BaseExpression *pBVar17;
  FunctionExpression *pFVar18;
  reference pvVar19;
  pointer pPVar20;
  ConstantExpression *pCVar21;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> _Var22;
  InternalException *this_00;
  ParserException *this_01;
  NotImplementedException *pNVar23;
  long in_RDX;
  PGAExpr *op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Transformer *pTVar24;
  string *this_02;
  Transformer *pTVar25;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_03;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_110;
  undefined1 local_108 [9];
  undefined7 uStack_ff;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  char *regex_function;
  __node_base _Stack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_b8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_b0;
  __buckets_ptr local_a8;
  __node_base local_a0;
  __node_base local_98;
  __node_base local_90;
  Transformer *local_88;
  string name;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  pointer local_58;
  pointer puStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  regex_function = (char *)**(undefined8 **)(*(long *)(in_RDX + 8) + 8);
  pPVar12 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                      ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&regex_function);
  ::std::__cxx11::string::string((string *)&name,(pPVar12->val).str,(allocator *)&children);
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 1:
  case 2:
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    TransformExpression((Transformer *)(local_108 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    make_uniq<duckdb::SubqueryExpression>();
    make_uniq<duckdb::SelectStatement>();
    make_uniq<duckdb::SelectNode>();
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_108 + 8));
    pSVar13 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_b0);
    make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_a8,(char (*) [7])0x1fd339d,&children);
    regex_function = (char *)local_a8;
    local_a8 = (__buckets_ptr)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar13->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&regex_function);
    if (regex_function != (char *)0x0) {
      (**(code **)(*(long *)regex_function + 8))();
    }
    regex_function = (char *)0x0;
    if (local_a8 != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8)[1]._M_nxt)();
    }
    make_uniq<duckdb::EmptyTableRef>();
    pcVar6 = regex_function;
    regex_function = (char *)0x0;
    pSVar13 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_b0);
    _Var1._M_head_impl =
         (pSVar13->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar13->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)pcVar6;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (regex_function != (char *)0x0) {
      (**(code **)(*(long *)regex_function + 8))();
    }
    _Var8._M_head_impl = local_b0._M_head_impl;
    local_b0._M_head_impl = (QueryNode *)0x0;
    pSVar14 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_b8);
    _Var2._M_head_impl =
         (pSVar14->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar14->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_110);
    _Var7._M_head_impl = local_b8._M_head_impl;
    local_b8._M_head_impl = (SelectStatement *)0x0;
    _Var3._M_head_impl =
         (pSVar15->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar15->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var3._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_SQLStatement + 8))();
    }
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_110);
    pSVar15->subquery_type = ANY;
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_110);
    uVar5 = local_108._0_8_;
    local_108._0_8_ = (Transformer *)0x0;
    _Var4._M_head_impl =
         (pSVar15->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar15->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar5;
    if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    }
    EVar10 = OperatorToExpressionType(&name);
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_110);
    pSVar15->comparison_type = EVar10;
    expr = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                        *)&local_110);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x20));
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_110);
    _Var22._M_head_impl = local_110._M_head_impl;
    if (pSVar15->comparison_type == INVALID) {
      this_01 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&regex_function,"Unsupported comparison \"%s\" for ANY/ALL subquery",
                 (allocator *)&local_a8);
      ::std::__cxx11::string::string((string *)&local_40,(string *)&name);
      ParserException::ParserException<std::__cxx11::string>
                (this_01,(string *)&regex_function,&local_40);
      __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(int *)(in_RDX + 4) == 2) {
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_110);
      EVar10 = NegateComparisonExpression(pSVar15->comparison_type);
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_110);
      pSVar15->comparison_type = EVar10;
      local_a8 = (__buckets_ptr)CONCAT71(local_a8._1_7_,0xd);
      make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::SubqueryExpression,std::default_delete<duckdb::SubqueryExpression>,true>>
                ((duckdb *)&regex_function,(ExpressionType *)&local_a8,
                 (unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                  *)&local_110);
      _Var22._M_head_impl = (SubqueryExpression *)regex_function;
    }
    else {
      local_110._M_head_impl = (SubqueryExpression *)0x0;
    }
    (this->parent).ptr = (Transformer *)_Var22._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    if (local_b0._M_head_impl != (QueryNode *)0x0) {
      (*(local_b0._M_head_impl)->_vptr_QueryNode[1])();
    }
    if ((Transformer *)local_b8._M_head_impl != (Transformer *)0x0) {
      (*((local_b8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    if ((Transformer *)local_110._M_head_impl != (Transformer *)0x0) {
      (*(code *)((Transformer *)
                ((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression)->options)();
    }
    break;
  case 3:
    TransformExpression((Transformer *)&regex_function,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    TransformExpression((Transformer *)&children,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    local_108[8] = 0x25;
    make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)local_108,local_108 + 8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&regex_function,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&children);
    goto LAB_01a96f7f;
  case 4:
    TransformExpression((Transformer *)&regex_function,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    TransformExpression((Transformer *)&children,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    local_108[8] = 0x28;
    make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)local_108,local_108 + 8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&regex_function,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&children);
LAB_01a96f7f:
    (this->parent).ptr = (Transformer *)local_108._0_8_;
    pTVar24 = (Transformer *)
              children.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_01a97107:
    pTVar25 = (Transformer *)regex_function;
    if (pTVar24 != (Transformer *)0x0) {
      (*((BaseExpression *)&pTVar24->parent)->_vptr_BaseExpression[1])();
      pTVar25 = (Transformer *)regex_function;
    }
    goto LAB_01a972ec;
  case 5:
    regex_function = (char *)0x0;
    _Stack_d0._M_nxt = (_Hash_node_base *)0x0;
    local_c8._M_allocated_capacity = 0;
    TransformExpression((Transformer *)&children,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&regex_function,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&children);
    if (children.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((children.
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    TransformExpression((Transformer *)&children,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&regex_function,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&children);
    if (children.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((children.
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&children,(char (*) [7])"nullif",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&regex_function);
    (this->parent).ptr =
         (Transformer *)
         children.
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&regex_function);
    goto LAB_01a972f7;
  default:
    TransformExpression((Transformer *)&children,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    op = root;
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    sVar9 = name._M_string_length;
    if (children.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      local_88 = (Transformer *)local_108._0_8_;
      local_108._0_8_ = (Transformer *)0x0;
      TransformUnaryOperator
                (this,(string *)op,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&name);
      if (local_88 != (Transformer *)0x0) {
        (*((BaseExpression *)&local_88->parent)->_vptr_BaseExpression[1])();
      }
      local_88 = (Transformer *)0x0;
    }
    else {
      if ((Transformer *)local_108._0_8_ == (Transformer *)0x0) {
        __lhs = &name;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &regex_function,__lhs,"__postfix");
        local_90._M_nxt =
             (_Hash_node_base *)
             children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        children.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        TransformUnaryOperator
                  (this,__lhs,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&regex_function);
        if (local_90._M_nxt != (__node_base_ptr)0x0) {
          (**(code **)&(((((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            *)&(local_90._M_nxt)->_M_nxt)->_M_t).
                         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        local_90._M_nxt = (__node_base_ptr)0x0;
        this_02 = (string *)&regex_function;
      }
      else {
        local_60._M_head_impl = (ParsedExpression *)&stack0xffffffffffffffb0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p == &name.field_2) {
          puStack_48 = (pointer)name.field_2._8_8_;
        }
        else {
          local_60._M_head_impl = (ParsedExpression *)name._M_dataplus._M_p;
        }
        name._M_string_length = 0;
        local_58 = (pointer)sVar9;
        name.field_2._M_local_buf[0] = '\0';
        local_98._M_nxt =
             (_Hash_node_base *)
             children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        children.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0._M_nxt = (_Hash_node_base *)local_108._0_8_;
        local_108._0_8_ = (Transformer *)0x0;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        TransformBinaryOperator
                  (this,(string *)root,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_60,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_98);
        if ((Transformer *)local_a0._M_nxt != (Transformer *)0x0) {
          (*((BaseExpression *)&(local_a0._M_nxt)->_M_nxt)->_vptr_BaseExpression[1])();
        }
        local_a0._M_nxt = (_Hash_node_base *)0x0;
        if (local_98._M_nxt != (_Hash_node_base *)0x0) {
          (**(code **)&(((((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            *)&(local_98._M_nxt)->_M_nxt)->_M_t).
                         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        local_98._M_nxt = (_Hash_node_base *)0x0;
        this_02 = (string *)&local_60;
      }
      ::std::__cxx11::string::~string(this_02);
    }
    pTVar25 = (Transformer *)
              children.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
      (*((BaseExpression *)local_108._0_8_)->_vptr_BaseExpression[1])();
      pTVar25 = (Transformer *)
                children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    goto LAB_01a972ec;
  case 7:
    TransformInExpression(this,(string *)root,(PGAExpr *)&name);
    goto LAB_01a972f7;
  case 0xb:
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    TransformExpression((Transformer *)(local_108 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
    pBVar17 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(local_108 + 8))->super_BaseExpression;
    pFVar18 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar17);
    this_03 = &pFVar18->children;
    pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_03,1);
    pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar19);
    if ((pPVar20->super_BaseExpression).type != VALUE_CONSTANT) {
      pNVar23 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&regex_function,"Custom escape in SIMILAR TO",(allocator *)&local_110);
      NotImplementedException::NotImplementedException(pNVar23,(string *)&regex_function);
      __cxa_throw(pNVar23,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_03,1);
    pBVar17 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar19)->super_BaseExpression;
    pCVar21 = BaseExpression::Cast<duckdb::ConstantExpression>(pBVar17);
    if ((pCVar21->value).is_null == false) {
      pNVar23 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&regex_function,"Custom escape in SIMILAR TO",(allocator *)&local_110);
      NotImplementedException::NotImplementedException(pNVar23,(string *)&regex_function);
      __cxa_throw(pNVar23,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar19 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_03,0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,pvVar19);
    bVar11 = ::std::operator==(&name,"!~");
    regex_function = "regexp_full_match";
    make_uniq<duckdb::FunctionExpression,char_const*const&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_110,&regex_function,&children);
    if (bVar11) {
      local_b0._M_head_impl._0_1_ = 0xd;
      make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::FunctionExpression,std::default_delete<duckdb::FunctionExpression>,true>>
                ((duckdb *)&local_b8,(ExpressionType *)&local_b0,
                 (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                  *)&local_110);
      (this->parent).ptr = (Transformer *)local_b8._M_head_impl;
      if ((Transformer *)local_110._M_head_impl != (Transformer *)0x0) {
        (*(code *)((Transformer *)
                  ((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                  _vptr_BaseExpression)->options)();
      }
    }
    else {
      (this->parent).ptr = (Transformer *)local_110._M_head_impl;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    break;
  case 0xc:
  case 0xd:
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(in_RDX + 0x18);
    pPVar16 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->
                        ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&children);
    if (((pPVar16->length != 2) ||
        (pPVar16 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->
                             ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&children),
        (pPVar16->head->data).ptr_value == (void *)0x0)) ||
       (pPVar16 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->
                            ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&children),
       (pPVar16->tail->data).ptr_value == (void *)0x0)) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&regex_function,"(NOT) BETWEEN needs two args",(allocator *)local_108);
      InternalException::InternalException(this_00,(string *)&regex_function);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpression((Transformer *)&regex_function,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    optional_ptr<duckdb_libpgquery::PGList,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&children);
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    optional_ptr<duckdb_libpgquery::PGList,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&children);
    TransformExpression((Transformer *)(local_108 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    make_uniq<duckdb::BetweenExpression,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_110,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&regex_function,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_108 + 8));
    if (*(int *)(in_RDX + 4) == 0xc) {
      (this->parent).ptr = (Transformer *)local_110._M_head_impl;
    }
    else {
      local_b0._M_head_impl._0_1_ = 0xd;
      make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::BetweenExpression,std::default_delete<duckdb::BetweenExpression>,true>>
                ((duckdb *)&local_b8,(ExpressionType *)&local_b0,
                 (unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
                  *)&local_110);
      (this->parent).ptr = (Transformer *)local_b8._M_head_impl;
      if ((Transformer *)local_110._M_head_impl != (Transformer *)0x0) {
        (*(code *)((Transformer *)
                  ((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                  _vptr_BaseExpression)->options)();
      }
    }
    pTVar24 = (Transformer *)local_108._0_8_;
    if ((long *)CONCAT71(uStack_ff,local_108[8]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_ff,local_108[8]) + 8))();
      pTVar24 = (Transformer *)local_108._0_8_;
    }
    goto LAB_01a97107;
  }
  pTVar25 = (Transformer *)local_108._0_8_;
  if ((long *)CONCAT71(uStack_ff,local_108[8]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(uStack_ff,local_108[8]) + 8))();
    pTVar25 = (Transformer *)local_108._0_8_;
  }
LAB_01a972ec:
  if (pTVar25 != (Transformer *)0x0) {
    (*((BaseExpression *)&pTVar25->parent)->_vptr_BaseExpression[1])();
  }
LAB_01a972f7:
  ::std::__cxx11::string::~string((string *)&name);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformAExprInternal(duckdb_libpgquery::PGAExpr &root) {
	auto name = string(PGPointerCast<duckdb_libpgquery::PGValue>(root.name->head->data.ptr_value)->val.str);

	switch (root.kind) {
	case duckdb_libpgquery::PG_AEXPR_OP_ALL:
	case duckdb_libpgquery::PG_AEXPR_OP_ANY: {
		// left=ANY(right)
		// we turn this into left=ANY((SELECT UNNEST(right)))
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);

		auto subquery_expr = make_uniq<SubqueryExpression>();
		auto select_statement = make_uniq<SelectStatement>();
		auto select_node = make_uniq<SelectNode>();
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(right_expr));

		select_node->select_list.push_back(make_uniq<FunctionExpression>("UNNEST", std::move(children)));
		select_node->from_table = make_uniq<EmptyTableRef>();
		select_statement->node = std::move(select_node);
		subquery_expr->subquery = std::move(select_statement);
		subquery_expr->subquery_type = SubqueryType::ANY;
		subquery_expr->child = std::move(left_expr);
		subquery_expr->comparison_type = OperatorToExpressionType(name);
		SetQueryLocation(*subquery_expr, root.location);
		if (subquery_expr->comparison_type == ExpressionType::INVALID) {
			throw ParserException("Unsupported comparison \"%s\" for ANY/ALL subquery", name);
		}

		if (root.kind == duckdb_libpgquery::PG_AEXPR_OP_ALL) {
			// ALL sublink is equivalent to NOT(ANY) with inverted comparison
			// e.g. [= ALL()] is equivalent to [NOT(<> ANY())]
			// first invert the comparison type
			subquery_expr->comparison_type = NegateComparisonExpression(subquery_expr->comparison_type);
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(subquery_expr));
		}
		return std::move(subquery_expr);
	}
	case duckdb_libpgquery::PG_AEXPR_IN: {
		return TransformInExpression(name, root);
	}
	// rewrite NULLIF(a, b) into CASE WHEN a=b THEN NULL ELSE a END
	case duckdb_libpgquery::PG_AEXPR_NULLIF: {
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(TransformExpression(root.lexpr));
		children.push_back(TransformExpression(root.rexpr));
		return make_uniq<FunctionExpression>("nullif", std::move(children));
	}
	// rewrite (NOT) X BETWEEN A AND B into (NOT) AND(GREATERTHANOREQUALTO(X,
	// A), LESSTHANOREQUALTO(X, B))
	case duckdb_libpgquery::PG_AEXPR_BETWEEN:
	case duckdb_libpgquery::PG_AEXPR_NOT_BETWEEN: {
		auto between_args = PGPointerCast<duckdb_libpgquery::PGList>(root.rexpr);
		if (between_args->length != 2 || !between_args->head->data.ptr_value || !between_args->tail->data.ptr_value) {
			throw InternalException("(NOT) BETWEEN needs two args");
		}

		auto input = TransformExpression(root.lexpr);
		auto between_left =
		    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(between_args->head->data.ptr_value));
		auto between_right =
		    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(between_args->tail->data.ptr_value));

		auto compare_between =
		    make_uniq<BetweenExpression>(std::move(input), std::move(between_left), std::move(between_right));
		if (root.kind == duckdb_libpgquery::PG_AEXPR_BETWEEN) {
			return std::move(compare_between);
		} else {
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(compare_between));
		}
	}
	// rewrite SIMILAR TO into regexp_full_match('asdf', '.*sd.*')
	case duckdb_libpgquery::PG_AEXPR_SIMILAR: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);

		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(left_expr));

		auto &similar_func = right_expr->Cast<FunctionExpression>();
		D_ASSERT(similar_func.function_name == "similar_escape");
		D_ASSERT(similar_func.children.size() == 2);
		if (similar_func.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			throw NotImplementedException("Custom escape in SIMILAR TO");
		}
		auto &constant = similar_func.children[1]->Cast<ConstantExpression>();
		if (!constant.value.IsNull()) {
			throw NotImplementedException("Custom escape in SIMILAR TO");
		}
		// take the child of the similar_func
		children.push_back(std::move(similar_func.children[0]));

		// this looks very odd, but seems to be the way to find out its NOT IN
		bool invert_similar = false;
		if (name == "!~") {
			// NOT SIMILAR TO
			invert_similar = true;
		}
		const auto regex_function = "regexp_full_match";
		auto result = make_uniq<FunctionExpression>(regex_function, std::move(children));

		if (invert_similar) {
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(result));
		} else {
			return std::move(result);
		}
	}
	case duckdb_libpgquery::PG_AEXPR_NOT_DISTINCT: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);
		return make_uniq<ComparisonExpression>(ExpressionType::COMPARE_NOT_DISTINCT_FROM, std::move(left_expr),
		                                       std::move(right_expr));
	}
	case duckdb_libpgquery::PG_AEXPR_DISTINCT: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);
		return make_uniq<ComparisonExpression>(ExpressionType::COMPARE_DISTINCT_FROM, std::move(left_expr),
		                                       std::move(right_expr));
	}

	default:
		break;
	}
	auto left_expr = TransformExpression(root.lexpr);
	auto right_expr = TransformExpression(root.rexpr);

	if (!left_expr) {
		// prefix operator
		return TransformUnaryOperator(name, std::move(right_expr));
	} else if (!right_expr) {
		// postfix operator, only ! is currently supported
		return TransformUnaryOperator(name + "__postfix", std::move(left_expr));
	} else {
		return TransformBinaryOperator(std::move(name), std::move(left_expr), std::move(right_expr));
	}
}